

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

void ** __thiscall TCMallocImplementation::ReadHeapGrowthStackTraces(TCMallocImplementation *this)

{
  void **in_RAX;
  void **local_18;
  
  local_18 = in_RAX;
  tcmalloc::ProduceStackTracesDump
            ((tcmalloc *)&local_18,ReadHeapGrowthStackTraces::anon_class_1_0_00000001::__invoke,
             tcmalloc::Static::growth_stacks_);
  return local_18;
}

Assistant:

virtual void** ReadHeapGrowthStackTraces() {
    // Note: growth stacks are append only, and updated atomically. So
    // we can just read them without any locks. And use arbitrarily long
    // (since they're never cleared/deleted).
    const StackTrace* head = Static::growth_stacks();
    return ProduceStackTracesDump(
      +[] (const void** current_head) {
        const StackTrace* current = static_cast<const StackTrace*>(*current_head);
        *current_head = current->stack[tcmalloc::kMaxStackDepth-1];
        return current;
      }, head).release();
  }